

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int parse_value(frozen *f)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  json_type t;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  bool bVar9;
  
  pbVar3 = (byte *)f->end;
  pbVar5 = (byte *)f->cur;
  if (pbVar5 < pbVar3) {
    do {
      if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
      pbVar5 = pbVar5 + 1;
      f->cur = (char *)pbVar5;
    } while (pbVar5 != pbVar3);
  }
  pbVar5 = (byte *)f->cur;
  uVar7 = 0xffffffff;
  if (pbVar5 < pbVar3) {
    uVar7 = (uint)*pbVar5;
  }
  if (0x5a < (int)uVar7) {
    if ((int)uVar7 < 0x6e) {
      if (uVar7 == 0x5b) {
        iVar4 = test_and_skip(f,0x5b);
        if ((-1 < iVar4) && (iVar4 = capture_ptr(f,f->cur + -1,JSON_TYPE_ARRAY), -1 < iVar4)) {
          iVar2 = f->num_tokens;
LAB_00112905:
          pbVar3 = (byte *)f->end;
          pbVar5 = (byte *)f->cur;
          if (pbVar5 < pbVar3) {
            do {
              if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
              break;
              pbVar5 = pbVar5 + 1;
              f->cur = (char *)pbVar5;
            } while (pbVar5 != pbVar3);
          }
          if ((pbVar3 <= f->cur) || (*f->cur != 0x5d)) {
            iVar4 = parse_value(f);
            if (iVar4 < 0) goto joined_r0x001129a0;
            pbVar3 = (byte *)f->end;
            pbVar5 = (byte *)f->cur;
            if (pbVar5 < pbVar3) {
              do {
                if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
                break;
                pbVar5 = pbVar5 + 1;
                f->cur = (char *)pbVar5;
              } while (pbVar5 != pbVar3);
            }
            pbVar5 = (byte *)f->cur;
            if ((pbVar5 < pbVar3) && (*pbVar5 == 0x2c)) {
              f->cur = (char *)(pbVar5 + 1);
            }
            goto LAB_00112905;
          }
          iVar4 = test_and_skip(f,0x5d);
          if (-1 < iVar4) {
            pcVar8 = f->cur;
            goto LAB_00112aa9;
          }
        }
        goto joined_r0x001129a0;
      }
      if (uVar7 != 0x66) {
LAB_001129b5:
        return ~(uint)(uVar7 == 0xffffffff);
      }
      pcVar8 = "false";
      iVar4 = 5;
      t = JSON_TYPE_FALSE;
    }
    else if (uVar7 == 0x6e) {
      pcVar8 = "null";
      iVar4 = 4;
      t = JSON_TYPE_NULL;
    }
    else {
      if (uVar7 != 0x74) {
        if (uVar7 != 0x7b) goto LAB_001129b5;
        iVar4 = parse_object(f);
        goto joined_r0x001129a0;
      }
      pcVar8 = "true";
      iVar4 = 4;
      t = JSON_TYPE_TRUE;
    }
    iVar4 = expect(f,pcVar8,iVar4,t);
    goto joined_r0x001129a0;
  }
  if (9 < uVar7 - 0x30) {
    if (uVar7 == 0x22) {
      iVar4 = parse_string(f);
      goto joined_r0x001129a0;
    }
    if (uVar7 != 0x2d) goto LAB_001129b5;
  }
  if (pbVar5 < pbVar3) {
    do {
      if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
      pbVar5 = pbVar5 + 1;
      f->cur = (char *)pbVar5;
    } while (pbVar5 != pbVar3);
  }
  pbVar5 = (byte *)f->cur;
  if (pbVar5 < pbVar3) {
    bVar9 = *pbVar5 == 0x2d;
  }
  else {
    bVar9 = false;
  }
  iVar4 = capture_ptr(f,(char *)pbVar5,JSON_TYPE_NUMBER);
  if (iVar4 < 0) goto joined_r0x001129a0;
  if (bVar9) {
    f->cur = f->cur + 1;
  }
  pbVar3 = (byte *)f->end;
  pbVar5 = (byte *)f->cur;
  iVar4 = -2;
  if (pbVar3 <= pbVar5) goto joined_r0x001129a0;
  if ((int)(char)*pbVar5 - 0x3aU < 0xfffffff6) {
LAB_001127f5:
    iVar4 = -1;
    goto joined_r0x001129a0;
  }
  bVar6 = *pbVar5;
  if ((int)(char)bVar6 - 0x3aU < 0xfffffff6) {
    bVar9 = true;
  }
  else {
    do {
      pbVar5 = pbVar5 + 1;
      f->cur = (char *)pbVar5;
      if (pbVar5 == pbVar3) goto LAB_00112a2b;
      bVar6 = *pbVar5;
    } while (0xfffffff5 < (int)(char)bVar6 - 0x3aU);
    bVar9 = pbVar5 < pbVar3;
  }
  if (!(bool)(bVar9 ^ 1U | bVar6 != 0x2e)) {
    pbVar5 = pbVar5 + 1;
    f->cur = (char *)pbVar5;
    if (pbVar3 <= pbVar5) goto joined_r0x001129a0;
    if ((int)(char)*pbVar5 - 0x3aU < 0xfffffff6) goto LAB_001127f5;
    do {
      if ((int)(char)*pbVar5 - 0x3aU < 0xfffffff6) break;
      pbVar5 = pbVar5 + 1;
      f->cur = (char *)pbVar5;
    } while (pbVar5 != pbVar3);
  }
LAB_00112a2b:
  pbVar5 = (byte *)f->cur;
  if ((pbVar5 < pbVar3) && ((*pbVar5 | 0x20) == 0x65)) {
    pbVar1 = pbVar5 + 1;
    f->cur = (char *)pbVar1;
    if (pbVar3 <= pbVar1) goto joined_r0x001129a0;
    if ((*pbVar1 == 0x2d) || (*pbVar1 == 0x2b)) {
      f->cur = (char *)(pbVar5 + 2);
    }
    pbVar5 = (byte *)f->cur;
    if ((pbVar3 <= pbVar5) || (iVar4 = -1, (int)(char)*pbVar5 - 0x3aU < 0xfffffff6))
    goto joined_r0x001129a0;
    do {
      if ((int)(char)*pbVar5 - 0x3aU < 0xfffffff6) break;
      pbVar5 = pbVar5 + 1;
      f->cur = (char *)pbVar5;
    } while (pbVar5 != pbVar3);
  }
  iVar2 = f->num_tokens;
  pcVar8 = f->cur;
LAB_00112aa9:
  capture_len(f,iVar2 + -1,pcVar8);
  iVar4 = 0;
joined_r0x001129a0:
  if (-1 < iVar4) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int parse_value(struct frozen *f) {
    int ch = cur(f);

    switch (ch) {
        case '"':
            TRY(parse_string(f));
            break;
        case '{':
            TRY(parse_object(f));
            break;
        case '[':
            TRY(parse_array(f));
            break;
        case 'n':
            TRY(expect(f, "null", 4, JSON_TYPE_NULL));
            break;
        case 't':
            TRY(expect(f, "true", 4, JSON_TYPE_TRUE));
            break;
        case 'f':
            TRY(expect(f, "false", 5, JSON_TYPE_FALSE));
            break;
        case '-':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
            TRY(parse_number(f));
            break;
        default:
            return ch == END_OF_STRING ? JSON_STRING_INCOMPLETE : JSON_STRING_INVALID;
    }

    return 0;
}